

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrics.c
# Opt level: O2

unsigned_long total_jiffies_func(void)

{
  uint uVar1;
  char *pcVar2;
  unsigned_long uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  sensor_slurp proc_stat;
  char *local_2040;
  sensor_slurp local_2038;
  
  memcpy(&local_2038,&PTR_anon_var_dwarf_3c461_00162aa0,0x2008);
  pcVar2 = update_file(&local_2038);
  pcVar2 = skip_token(pcVar2);
  local_2040 = skip_whitespace(pcVar2);
  dVar4 = strtod(local_2040,&local_2040);
  local_2040 = skip_whitespace(local_2040);
  dVar5 = strtod(local_2040,&local_2040);
  local_2040 = skip_whitespace(local_2040);
  dVar6 = strtod(local_2040,&local_2040);
  local_2040 = skip_whitespace(local_2040);
  dVar7 = strtod(local_2040,&local_2040);
  uVar1 = num_cpustates_func();
  if (uVar1 == 4) {
    uVar3 = ((long)dVar6 & 0xffffffffU) + ((long)dVar7 & 0xffffffffU) +
            ((long)dVar5 & 0xffffffffU) + ((long)dVar4 & 0xffffffffU);
  }
  else {
    local_2040 = skip_whitespace(local_2040);
    dVar8 = strtod(local_2040,&local_2040);
    local_2040 = skip_whitespace(local_2040);
    dVar9 = strtod(local_2040,&local_2040);
    local_2040 = skip_whitespace(local_2040);
    dVar10 = strtod(local_2040,&local_2040);
    uVar3 = ((long)dVar6 & 0xffffffffU) + ((long)dVar7 & 0xffffffffU) +
            ((long)dVar5 & 0xffffffffU) + ((long)dVar4 & 0xffffffffU) +
            ((long)dVar10 & 0xffffffffU) + ((long)dVar9 & 0xffffffffU) + ((long)dVar8 & 0xffffffffU)
    ;
  }
  return uVar3;
}

Assistant:

unsigned long total_jiffies_func ( void ) {

   char *p;
   unsigned long user_jiffies, nice_jiffies, system_jiffies, idle_jiffies,
                 wio_jiffies, irq_jiffies, sirq_jiffies;
	
   sensor_slurp proc_stat = { "/proc/stat" };
   p = update_file(&proc_stat);
   p = skip_token(p);
   p = skip_whitespace(p);
   user_jiffies = (unsigned int)strtod( p, &p );
   p = skip_whitespace(p);
   nice_jiffies = (unsigned int)strtod( p, &p ); 
   p = skip_whitespace(p);
   system_jiffies = (unsigned int)strtod( p , &p ); 
   p = skip_whitespace(p);
   idle_jiffies = (unsigned int)strtod( p , &p );

   int num_cpustates = num_cpustates_func();
   if(num_cpustates == 4) /*NUM_CPUSTATES_24X*/
       return user_jiffies + nice_jiffies + system_jiffies + idle_jiffies;

   p = skip_whitespace(p);
   wio_jiffies = (unsigned int)strtod( p , &p );
   p = skip_whitespace(p);
   irq_jiffies = (unsigned int)strtod( p , &p );
   p = skip_whitespace(p);
   sirq_jiffies = (unsigned int)strtod( p , &p );
  
   return user_jiffies + nice_jiffies + system_jiffies + idle_jiffies +
          wio_jiffies + irq_jiffies + sirq_jiffies; 
}